

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_make_hist(fitsfile *fptr,fitsfile *histptr,int bitpix,int naxis,long *naxes,int *colnum,
                  float *amin,float *amax,float *binsize,float weight,int wtcolnum,int recip,
                  char *selectrow,int *status)

{
  ulong uVar1;
  ulong uVar2;
  double binsized [4];
  double amaxd [4];
  double amind [4];
  
  if (*status == 0) {
    if (0 < naxis) {
      uVar2 = 4;
      if (naxis < 4) {
        uVar2 = (ulong)(uint)naxis;
      }
      uVar1 = 0;
      do {
        amind[uVar1] = (double)amin[uVar1];
        amaxd[uVar1] = (double)amax[uVar1];
        binsized[uVar1] = (double)binsize[uVar1];
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    fits_make_histde(fptr,histptr,(int *)0x0,bitpix,naxis,naxes,colnum,(char **)0x0,amind,amaxd,
                     binsized,(double)weight,wtcolnum,(char *)0x0,recip,selectrow,status);
  }
  return *status;
}

Assistant:

int fits_make_hist(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,    /* I - column numbers (array length = naxis)   */
    float *amin,     /* I - minimum histogram value, for each axis */
    float *amax,     /* I - maximum histogram value, for each axis */
    float *binsize, /* I - bin size along each axis               */
    float weight,        /* I - binning weighting factor          */
    int wtcolnum, /* I - optional keyword or col for weight*/
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
  double amind[4], amaxd[4], binsized[4], weightd;

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      amaxd[i] = (double) amax[i];
      binsized[i] = (double) binsize[i];
    }

    weightd = (double) weight;

    fits_make_histd(fptr, histptr, bitpix, naxis, naxes, colnum,
		    amind, amaxd, binsized, weight, wtcolnum, recip,
		    selectrow, status);
  }

  return (*status);
}